

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StorageReader.cpp
# Opt level: O3

vector<unsigned_long,_std::allocator<unsigned_long>_> * __thiscall
MILBlob::Blob::StorageReader::Impl::GetAllOffsets
          (vector<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__,Impl *this)

{
  iterator __position;
  uint uVar1;
  ulong __n;
  Span<const_unsigned_char,_18446744073709551615UL> SVar2;
  anon_class_8_1_8991fb9c load;
  anon_class_8_1_898e71e4 local_70;
  blob_metadata local_68;
  
  local_70.load = (anon_class_8_1_8991fb9c *)&local_68;
  local_68._0_8_ = this;
  std::call_once<MILBlob::Blob::StorageReader::Impl::EnsureLoaded()const::_lambda()_2_>
            (&this->m_loadedFlag,&local_70);
  SVar2 = MMapFileReader::ReadData
                    ((this->m_reader)._M_t.
                     super___uniq_ptr_impl<const_MILBlob::Blob::MMapFileReader,_std::default_delete<const_MILBlob::Blob::MMapFileReader>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_const_MILBlob::Blob::MMapFileReader_*,_std::default_delete<const_MILBlob::Blob::MMapFileReader>_>
                     .super__Head_base<0UL,_const_MILBlob::Blob::MMapFileReader_*,_false>.
                     _M_head_impl,0,0x40);
  uVar1 = *(uint *)SVar2.m_ptr;
  __n = (ulong)uVar1;
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve(__return_storage_ptr__,__n);
  local_70.load = (anon_class_8_1_8991fb9c *)0x40;
  if (uVar1 != 0) {
    do {
      __position._M_current =
           (__return_storage_ptr__->
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>
                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)__return_storage_ptr__,
                   __position,(unsigned_long *)&local_70);
      }
      else {
        *__position._M_current = (unsigned_long)local_70.load;
        (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
        _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      GetMetadata(&local_68,this,(uint64_t)local_70.load);
      local_70.load =
           (anon_class_8_1_8991fb9c *)
           (local_68.sizeInBytes + local_68.offset + 0x3f & 0xffffffffffffffc0);
      uVar1 = (int)__n - 1;
      __n = (ulong)uVar1;
    } while (uVar1 != 0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint64_t> GetAllOffsets() const
    {
        EnsureLoaded();

        const auto& header = m_reader->ReadStruct<storage_header>(0);
        auto numBlobs = header.count;

        std::vector<uint64_t> allOffsets;
        allOffsets.reserve(numBlobs);
        // The first metadata offset lies just after the file header.
        uint64_t currMetadataOffset = sizeof(storage_header);
        for (uint32_t i = 0; i < numBlobs; ++i) {
            allOffsets.push_back(currMetadataOffset);
            auto metadata = GetMetadata(currMetadataOffset);
            // Update offset for next iteration to aligned value.
            currMetadataOffset = metadata.offset + metadata.sizeInBytes;
            if (currMetadataOffset % DefaultStorageAlignment != 0) {
                currMetadataOffset += DefaultStorageAlignment - currMetadataOffset % DefaultStorageAlignment;
            }
        }
        return allOffsets;
    }